

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Trigonometric.hpp
# Opt level: O1

ScalarType
mt::angle<mt::Vector3<mt::Dual<float>>>(Vector3<mt::Dual<float>_> *v1,Vector3<mt::Dual<float>_> *v2)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  ScalarType SVar14;
  float fVar15;
  float fVar16;
  undefined1 auVar17 [16];
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  
  fVar1 = (v1->x).mReal;
  fVar2 = (v1->y).mReal;
  fVar3 = (v2->x).mReal;
  fVar4 = (v2->y).mReal;
  fVar5 = (v1->z).mReal;
  fVar6 = (v2->z).mReal;
  fVar20 = fVar5 * fVar5 + fVar2 * fVar2 + fVar1 * fVar1;
  fVar13 = fVar6 * fVar6 + fVar4 * fVar4 + fVar3 * fVar3;
  fVar15 = fVar13 * fVar20;
  if (0.0 < fVar15) {
    fVar7 = (v2->x).mDual;
    fVar8 = (v2->y).mDual;
    fVar9 = (v2->z).mDual;
    fVar21 = fVar7 * fVar3 + fVar8 * fVar4 + fVar9 * fVar6;
    fVar10 = (v1->x).mDual;
    fVar11 = (v1->y).mDual;
    fVar12 = (v1->z).mDual;
    fVar22 = fVar10 * fVar1 + fVar11 * fVar2 + fVar12 * fVar5;
    fVar19 = fVar6 * fVar5 + fVar4 * fVar2 + fVar3 * fVar1;
    auVar17 = rsqrtss(ZEXT816(0),ZEXT416((uint)fVar15));
    fVar16 = auVar17._0_4_;
    fVar16 = (fVar15 * fVar16 * fVar16 + -3.0) * fVar16 * -0.5;
    fVar18 = fVar16 * fVar19;
    fVar15 = fVar18;
    if (1.0 <= fVar18) {
      fVar15 = 1.0;
    }
    SVar14.mReal = acosf((float)(-(uint)(fVar18 < -1.0) & 0xbf800000 |
                                ~-(uint)(fVar18 < -1.0) & (uint)fVar15));
    fVar18 = 1.0 - fVar18 * fVar18;
    auVar17 = rsqrtss(ZEXT816(0),ZEXT416((uint)fVar18));
    fVar15 = auVar17._0_4_;
    SVar14.mDual = fVar15 * -0.5 *
                   (fVar19 * (fVar13 * (fVar22 + fVar22) + fVar20 * (fVar21 + fVar21)) *
                    fVar16 * fVar16 * fVar16 * 0.5 -
                   (fVar12 * fVar6 + fVar11 * fVar4 +
                   fVar9 * fVar5 + fVar10 * fVar3 + fVar8 * fVar2 + fVar7 * fVar1) * fVar16) *
                   (fVar18 * fVar15 * fVar15 + -3.0);
    return SVar14;
  }
  __assert_fail("ispositive(a)",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/erwincoumans[P]motion-toolkit/moto/Scalar.hpp"
                ,0x112,"Scalar mt::rsqrt(Scalar) [Scalar = mt::Dual<float>]");
}

Assistant:

typename Vector::ScalarType angle(const Vector& v1, const Vector& v2)
    {
        return acos(dot(v1, v2) * rsqrt(lengthSquared(v1) * lengthSquared(v2)));
    }